

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

UnknownFieldSet * __thiscall
google::protobuf::Reflection::MutableUnknownFields(Reflection *this,Message *message)

{
  ulong uVar1;
  Descriptor *expected;
  UnknownFieldSet *pUVar2;
  Metadata MVar3;
  
  MVar3 = Message::GetMetadata(message);
  if (MVar3.reflection != this) {
    expected = this->descriptor_;
    MVar3 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar3.descriptor,(FieldDescriptor *)0x0,"MutableUnknownFields");
  }
  uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    return (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  pUVar2 = internal::InternalMetadata::
           mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                     (&(message->super_MessageLite)._internal_metadata_);
  return pUVar2;
}

Assistant:

UnknownFieldSet* Reflection::MutableUnknownFields(Message* message) const {
  STATIC_USAGE_CHECK_MESSAGE(MutableUnknownFields, message);
  return MutableInternalMetadata(message)
      ->mutable_unknown_fields<UnknownFieldSet>();
}